

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

void __thiscall
OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_
          (OSTEI_VRR_Algorithm_Base *this,QAMList *order,QAM *am)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> _Var4;
  const_iterator cVar5;
  pointer pQVar6;
  QAMList req;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  QAM *local_e8;
  QAMList local_e0;
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  QAM local_98;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [24];
  
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<QAM*,std::vector<QAM,std::allocator<QAM>>>,__gnu_cxx::__ops::_Iter_equals_val<QAM_const>>
                    ((order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var4._M_current ==
      (order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    cVar5 = std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::find
                      (&(this->allam_)._M_t,am);
    p_Var1 = &(this->allam_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
      bVar3 = true;
    }
    else {
      local_108 = &local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
      local_98.tag._M_dataplus._M_p = (pointer)&local_98.tag.field_2;
      local_98.qam._M_elems[0] = 0;
      local_98.qam._M_elems[1] = 0;
      local_98.qam._M_elems[2] = 0;
      local_98.qam._M_elems[3] = 0;
      if (local_108 == &local_f8) {
        local_98.tag.field_2._8_8_ = local_f8._8_8_;
      }
      else {
        local_98.tag._M_dataplus._M_p = (pointer)local_108;
      }
      local_98.tag._M_string_length = local_100;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_108 = &local_f8;
      bVar3 = QAM::operator==(am,&local_98);
    }
    if ((_Rb_tree_header *)cVar5._M_node != p_Var1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.tag._M_dataplus._M_p != &local_98.tag.field_2) {
        operator_delete(local_98.tag._M_dataplus._M_p);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
    }
    if (bVar3 == false) {
      local_68._0_4_ = (am->qam)._M_elems[0];
      local_68._4_4_ = (am->qam)._M_elems[1];
      local_68._8_4_ = (am->qam)._M_elems[2];
      local_68._12_4_ = (am->qam)._M_elems[3];
      pcVar2 = (am->tag)._M_dataplus._M_p;
      local_58._M_p = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (am->tag)._M_string_length);
      GetAMReq(&local_e0,this,(QAM *)local_68);
      local_e8 = am;
      if (local_58._M_p != local_48) {
        operator_delete(local_58._M_p);
      }
      if (local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        pQVar6 = local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          local_c8._0_4_ = (pQVar6->qam)._M_elems[0];
          local_c8._4_4_ = (pQVar6->qam)._M_elems[1];
          local_c8._8_4_ = (pQVar6->qam)._M_elems[2];
          local_c8._12_4_ = (pQVar6->qam)._M_elems[3];
          pcVar2 = (pQVar6->tag)._M_dataplus._M_p;
          local_b8._M_p = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar2,pcVar2 + (pQVar6->tag)._M_string_length);
          AMOrder_AddWithDependencies_(this,order,(QAM *)local_c8);
          if (local_b8._M_p != local_a8) {
            operator_delete(local_b8._M_p);
          }
          pQVar6 = pQVar6 + 1;
        } while (pQVar6 != local_e0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      std::vector<QAM,_std::allocator<QAM>_>::push_back(order,local_e8);
      std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_e0);
    }
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_(QAMList & order, QAM am) const
{
    // skip if it was already done somewhere
    if(std::find(order.begin(), order.end(), am) != order.end())
        return;

    // skip if it's not done by VRR
    if(allam_.count(am) == 0 || am == QAM{0,0,0,0})
        return;

    // get requirements
    auto req = GetAMReq(am);

    for(const auto & it : req)
        AMOrder_AddWithDependencies_(order, it);

    order.push_back(am);
}